

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_8::CreateString(anon_unknown_8 *this,string_view value)

{
  string *p;
  TaggedStringPtr res;
  
  p = (string *)operator_new(0x20);
  (p->_M_dataplus)._M_p = (pointer)&p->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)p,value._M_len,this + value._M_len);
  TaggedStringPtr::SetAllocated(&res,p);
  return (TaggedStringPtr)res.ptr_;
}

Assistant:

inline TaggedStringPtr CreateString(absl::string_view value) {
  TaggedStringPtr res;
  res.SetAllocated(new std::string(value.data(), value.length()));
  return res;
}